

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O1

void __thiscall fizplex::LPTest_AddLogicals_Test::TestBody(LPTest_AddLogicals_Test *this)

{
  bool bVar1;
  size_t sVar2;
  Column *pCVar3;
  char *pcVar4;
  char *in_R9;
  size_t column;
  double rhs_value;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  LP lp;
  AssertHelper local_f8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  string local_e0;
  AssertHelper local_c0;
  LP local_b8;
  
  LP::LP(&local_b8);
  LP::add_column(&local_b8,Bounded,0.0,5.0,0.0);
  LP::add_row(&local_b8,Equality,1.0,1.0);
  LP::add_row(&local_b8,Range,3.0,15.0);
  LP::add_row(&local_b8,LE,-INFINITY,7.0);
  LP::add_row(&local_b8,NonBinding,-INFINITY,INFINITY);
  LP::add_row(&local_b8,GE,3.0,INFINITY);
  LP::add_logicals(&local_b8);
  sVar2 = LP::column_count(&local_b8);
  local_f0.ptr_._0_1_ = sVar2 == 6;
  local_e8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (sVar2 != 6) {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)&local_f0,(AssertionResult *)"lp.column_count() == 6","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x87,(char *)CONCAT71(local_e0._M_dataplus._M_p._1_7_,
                                      (char)local_e0._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_e0._M_dataplus._M_p._1_7_,(char)local_e0._M_dataplus._M_p) !=
        &local_e0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_e0._M_dataplus._M_p._1_7_,(char)local_e0._M_dataplus._M_p),
                      local_e0.field_2._M_allocated_capacity + 1);
    }
    if (local_f8.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_f8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_f8.data_ + 8))();
      }
      local_f8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pCVar3 = LP::column_header(&local_b8,1);
  local_f0.ptr_ = local_f0.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<fizplex::ColType,fizplex::ColType>
            ((internal *)&local_e0,"lp.column_header(1).type","ColType::Fixed",&pCVar3->type,
             (ColType *)&local_f0);
  if ((char)local_e0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_f0);
    if ((undefined8 *)local_e0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_e0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x89,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f0.ptr_ + 8))();
      }
      local_f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pCVar3 = LP::column_header(&local_b8,2);
  local_f0.ptr_._0_4_ = 1;
  testing::internal::CmpHelperEQ<fizplex::ColType,fizplex::ColType>
            ((internal *)&local_e0,"lp.column_header(2).type","ColType::Bounded",&pCVar3->type,
             (ColType *)&local_f0);
  if ((char)local_e0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_f0);
    if ((undefined8 *)local_e0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_e0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x8a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f0.ptr_ + 8))();
      }
      local_f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pCVar3 = LP::column_header(&local_b8,3);
  local_f0.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<fizplex::ColType,fizplex::ColType>
            ((internal *)&local_e0,"lp.column_header(3).type","ColType::LowerBound",&pCVar3->type,
             (ColType *)&local_f0);
  if ((char)local_e0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_f0);
    if ((undefined8 *)local_e0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_e0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x8b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f0.ptr_ + 8))();
      }
      local_f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pCVar3 = LP::column_header(&local_b8,4);
  local_f0.ptr_._0_4_ = 3;
  testing::internal::CmpHelperEQ<fizplex::ColType,fizplex::ColType>
            ((internal *)&local_e0,"lp.column_header(4).type","ColType::Free",&pCVar3->type,
             (ColType *)&local_f0);
  if ((char)local_e0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_f0);
    if ((undefined8 *)local_e0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_e0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x8c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f0.ptr_ + 8))();
      }
      local_f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pCVar3 = LP::column_header(&local_b8,5);
  local_f0.ptr_._0_4_ = 4;
  testing::internal::CmpHelperEQ<fizplex::ColType,fizplex::ColType>
            ((internal *)&local_e0,"lp.column_header(5).type","ColType::UpperBound",&pCVar3->type,
             (ColType *)&local_f0);
  if ((char)local_e0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_f0);
    if ((undefined8 *)local_e0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_e0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x8d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f0.ptr_ + 8))();
      }
      local_f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pCVar3 = LP::column_header(&local_b8,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_e0,"0.0","lp.column_header(1).lower",0.0,pCVar3->lower);
  if ((char)local_e0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_f0);
    if ((undefined8 *)local_e0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_e0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x8f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f0.ptr_ + 8))();
      }
      local_f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pCVar3 = LP::column_header(&local_b8,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_e0,"0.0","lp.column_header(1).upper",0.0,pCVar3->upper);
  if ((char)local_e0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_f0);
    if ((undefined8 *)local_e0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_e0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x90,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f0.ptr_ + 8))();
      }
      local_f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pCVar3 = LP::column_header(&local_b8,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_e0,"0.0","lp.column_header(2).lower",0.0,pCVar3->lower);
  if ((char)local_e0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_f0);
    if ((undefined8 *)local_e0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_e0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x91,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f0.ptr_ + 8))();
      }
      local_f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pCVar3 = LP::column_header(&local_b8,3);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_e0,"0.0","lp.column_header(3).lower",0.0,pCVar3->lower);
  if ((char)local_e0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_f0);
    if ((undefined8 *)local_e0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_e0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x92,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f0.ptr_ + 8))();
      }
      local_f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pCVar3 = LP::column_header(&local_b8,5);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_e0,"0.0","lp.column_header(5).upper",0.0,pCVar3->upper);
  if ((char)local_e0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_f0);
    if ((undefined8 *)local_e0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_e0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x93,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f0.ptr_ + 8))();
      }
      local_f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pCVar3 = LP::column_header(&local_b8,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&local_e0,"12.0","lp.column_header(2).upper",12.0,pCVar3->upper);
  if ((char)local_e0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_f0);
    if ((undefined8 *)local_e0._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_e0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x94,pcVar4);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    if (local_f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_f0.ptr_ + 8))();
      }
      local_f0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar2 = 0;
  do {
    column = sVar2 + 1;
    rhs_value = LP::get_value(&local_b8,sVar2,column);
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)&local_e0,"1.0","lp.get_value(i, 1 + i)",1.0,rhs_value);
    if ((char)local_e0._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_f0);
      pcVar4 = "";
      if ((undefined8 *)local_e0._M_string_length != (undefined8 *)0x0) {
        pcVar4 = *(char **)local_e0._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
                 ,0x97,pcVar4);
      testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      if (local_f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_f0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_f0.ptr_ + 8))();
        }
        local_f0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_e0._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    sVar2 = column;
  } while (column != 5);
  if (local_b8.rows.super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.rows.
                    super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.rows.
                          super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.rows.
                          super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.cols.super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.cols.
                    super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.cols.
                          super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.cols.
                          super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(local_b8.c.vals._M_data);
  operator_delete(local_b8.b.vals._M_data);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector
            ((vector<fizplex::SVector,_std::allocator<fizplex::SVector>_> *)&local_b8);
  return;
}

Assistant:

TEST(LPTest, AddLogicals) {
  LP lp;
  lp.add_column(ColType::Bounded, 0, 5);
  lp.add_row(RowType::Equality, 1, 1);
  lp.add_row(RowType::Range, 3, 15);
  lp.add_row(RowType::LE, -inf, 7);
  lp.add_row(RowType::NonBinding, -inf, inf);
  lp.add_row(RowType::GE, 3, inf);
  lp.add_logicals();

  EXPECT_TRUE(lp.column_count() == 6);

  EXPECT_EQ(lp.column_header(1).type, ColType::Fixed);
  EXPECT_EQ(lp.column_header(2).type, ColType::Bounded);
  EXPECT_EQ(lp.column_header(3).type, ColType::LowerBound);
  EXPECT_EQ(lp.column_header(4).type, ColType::Free);
  EXPECT_EQ(lp.column_header(5).type, ColType::UpperBound);

  EXPECT_DOUBLE_EQ(0.0, lp.column_header(1).lower);
  EXPECT_DOUBLE_EQ(0.0, lp.column_header(1).upper);
  EXPECT_DOUBLE_EQ(0.0, lp.column_header(2).lower);
  EXPECT_DOUBLE_EQ(0.0, lp.column_header(3).lower);
  EXPECT_DOUBLE_EQ(0.0, lp.column_header(5).upper);
  EXPECT_DOUBLE_EQ(12.0, lp.column_header(2).upper);

  for (int i = 0; i < 5; i++)
    EXPECT_DOUBLE_EQ(1.0, lp.get_value(i, 1 + i));
}